

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O0

int __thiscall cmXMLParser::ParseChunk(cmXMLParser *this,char *inputString,size_type length)

{
  ostream *this_00;
  int res;
  size_type length_local;
  char *inputString_local;
  cmXMLParser *this_local;
  
  if (this->Parser == (void *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Parser not initialized");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this->ParseError = 1;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = (*this->_vptr_cmXMLParser[0xd])(this,inputString,length);
    if (this_local._4_4_ == 0) {
      this->ParseError = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmXMLParser::ParseChunk(const char* inputString,
                            std::string::size_type length)
{
  if (!this->Parser) {
    std::cerr << "Parser not initialized" << std::endl;
    this->ParseError = 1;
    return 0;
  }
  int res;
  res = this->ParseBuffer(inputString, length);
  if (res == 0) {
    this->ParseError = 1;
  }
  return res;
}